

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::objectivec::anon_unknown_0::ExpectedPrefixesCollector::ConsumeLine
          (ExpectedPrefixesCollector *this,StringPiece *line,string *out_error)

{
  size_type *psVar1;
  char cVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  size_type sVar3;
  size_type sVar4;
  mapped_type *this_01;
  undefined8 *puVar5;
  long *plVar6;
  ulong *puVar7;
  size_type n;
  ulong uVar8;
  undefined8 uVar9;
  _Alloc_hider _Var10;
  StringPiece prefix;
  StringPiece package;
  string local_b0;
  string local_90;
  StringPiece local_70;
  ulong local_60 [2];
  string local_50;
  
  local_70.length_ = (size_type)local_70.ptr_;
  sVar4 = stringpiece_internal::StringPiece::find(line,'=',0);
  n = (size_type)(int)sVar4;
  if (n == 0xffffffffffffffff) {
    local_70.ptr_ = (char *)local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"Expected prefixes file line without equal sign: \'","");
    stringpiece_internal::StringPiece::ToString_abi_cxx11_(&local_90,line);
    uVar8 = 0xf;
    if ((ulong *)local_70.ptr_ != local_60) {
      uVar8 = local_60[0];
    }
    if (uVar8 < local_90._M_string_length + local_70.length_) {
      uVar9 = 0xf;
      if ((StringPiece *)local_90._M_dataplus._M_p != (StringPiece *)&local_90.field_2) {
        uVar9 = local_90.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar9 < local_90._M_string_length + local_70.length_) goto LAB_002765f0;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70.ptr_);
    }
    else {
LAB_002765f0:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90._M_dataplus._M_p);
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    psVar1 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar1) {
      local_b0.field_2._M_allocated_capacity = *psVar1;
      local_b0.field_2._8_8_ = puVar5[3];
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar1;
      local_b0._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_b0._M_string_length = puVar5[1];
    *puVar5 = psVar1;
    puVar5[1] = 0;
    *(undefined1 *)psVar1 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
    puVar7 = (ulong *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar7) {
      local_50.field_2._M_allocated_capacity = *puVar7;
      local_50.field_2._8_8_ = plVar6[3];
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    }
    else {
      local_50.field_2._M_allocated_capacity = *puVar7;
      local_50._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_50._M_string_length = plVar6[1];
    *plVar6 = (long)puVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)out_error,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((StringPiece *)local_90._M_dataplus._M_p != (StringPiece *)&local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    _Var10._M_p = local_70.ptr_;
    if ((ulong *)local_70.ptr_ == local_60) goto LAB_00276569;
  }
  else {
    local_70 = stringpiece_internal::StringPiece::substr(line,0,n);
    local_90._0_16_ =
         stringpiece_internal::StringPiece::substr
                   (line,(long)((sVar4 << 0x20) + 0x100000000) >> 0x20,0xffffffffffffffff);
    TrimWhitespace(&local_70);
    TrimWhitespace((StringPiece *)&local_90);
    sVar3 = local_90._M_string_length;
    if (1 < local_90._M_string_length) {
      cVar2 = *local_90._M_dataplus._M_p;
      if (((cVar2 == '\'') || (cVar2 == '\"')) &&
         (local_90._M_dataplus._M_p[local_90._M_string_length - 1] == cVar2)) {
        local_90._M_dataplus._M_p = local_90._M_dataplus._M_p + 1;
        local_90._M_string_length = local_90._M_string_length - 1;
        if (local_90._M_string_length == 0) {
          __assert_fail("length_ >= n",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/stringpiece.h"
                        ,0xfe,
                        "void google::protobuf::stringpiece_internal::StringPiece::remove_suffix(size_type)"
                       );
        }
        local_90._M_string_length = sVar3 - 2;
      }
    }
    stringpiece_internal::StringPiece::ToString_abi_cxx11_(&local_50,(StringPiece *)&local_90);
    this_00 = this->prefix_map_;
    stringpiece_internal::StringPiece::ToString_abi_cxx11_(&local_b0,&local_70);
    this_01 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](this_00,&local_b0);
    std::__cxx11::string::operator=((string *)this_01,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    _Var10._M_p = local_50._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_00276569;
  }
  operator_delete(_Var10._M_p);
LAB_00276569:
  return n != 0xffffffffffffffff;
}

Assistant:

bool ExpectedPrefixesCollector::ConsumeLine(
    const StringPiece& line, std::string* out_error) {
  int offset = line.find('=');
  if (offset == StringPiece::npos) {
    *out_error = std::string("Expected prefixes file line without equal sign: '") +
                 std::string(line) + "'.";
    return false;
  }
  StringPiece package = line.substr(0, offset);
  StringPiece prefix = line.substr(offset + 1);
  TrimWhitespace(&package);
  TrimWhitespace(&prefix);
  MaybeUnQuote(&prefix);
  // Don't really worry about error checking the package/prefix for
  // being valid.  Assume the file is validated when it is created/edited.
  (*prefix_map_)[std::string(package)] = std::string(prefix);
  return true;
}